

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,BlockStatement *stmt)

{
  iterator pos_00;
  bool bVar1;
  equal_to<const_slang::ast::Symbol_*> *this_00;
  StatementList *pSVar2;
  reference ppSVar3;
  size_type sVar4;
  raw_key_type *__y;
  pointer ppVar5;
  iterator pDVar6;
  long in_RSI;
  DataFlowAnalysis *in_RDI;
  DataFlowState *branchState;
  iterator __end0;
  iterator __begin0;
  SmallVector<slang::analysis::DataFlowState,_2UL> *__range4_2;
  iterator it_1;
  Statement *s_1;
  iterator __end4_1;
  iterator __begin4_1;
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> *__range4_1;
  type finalState;
  DataFlowState currState;
  Statement *s;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> *__range4;
  size_t numLocalDecls;
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> statements;
  Statement *stmtPtr;
  type_conflict1 *inserted;
  type *it;
  locator loc;
  size_t pos0;
  size_t hash;
  Symbol **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  SmallVector<slang::analysis::DataFlowState,_2UL> *in_stack_fffffffffffff808;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffff810;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> *in_stack_fffffffffffff818;
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> *in_stack_fffffffffffff820;
  flat_hash_map<const_Symbol_*,_SmallVector<DataFlowState>_> *pfVar7;
  try_emplace_args_t *in_stack_fffffffffffff828;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> *psVar8;
  size_t in_stack_fffffffffffff830;
  size_t in_stack_fffffffffffff838;
  undefined4 in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff844;
  SmallVector<slang::analysis::DataFlowState,_2UL> *in_stack_fffffffffffff850;
  raw_key_type *in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff860;
  uint in_stack_fffffffffffff864;
  SmallVector<slang::analysis::DataFlowState,_2UL> *args_2;
  flat_hash_map<const_Symbol_*,_SmallVector<DataFlowState>_> *pfVar9;
  DataFlowState *in_stack_fffffffffffff890;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
  *in_stack_fffffffffffff8a0;
  iterator local_730;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> local_720;
  table_element_pointer local_710;
  DataFlowState *in_stack_fffffffffffff900;
  DataFlowState *in_stack_fffffffffffff908;
  DataFlowAnalysis *in_stack_fffffffffffff910;
  DataFlowState *in_stack_fffffffffffff930;
  DataFlowState *in_stack_fffffffffffff938;
  DataFlowAnalysis *in_stack_fffffffffffff940;
  DataFlowState *in_stack_fffffffffffff998;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
  *in_stack_fffffffffffff9a0;
  __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
  local_5b8;
  pointer *local_5b0;
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> local_468;
  Statement *local_458;
  Statement **local_450;
  __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
  local_448;
  pointer *local_440;
  long local_438;
  pointer local_420;
  size_t local_418;
  undefined8 local_410;
  type_conflict1 *local_408;
  type *local_400;
  SmallVector<slang::analysis::DataFlowState,_2UL> local_3e8;
  undefined8 local_290;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_288;
  long local_270;
  SmallVector<slang::analysis::DataFlowState,_2UL> *local_260;
  undefined8 *local_258;
  flat_hash_map<const_Symbol_*,_SmallVector<DataFlowState>_> *local_250;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> *local_248;
  flat_hash_map<const_Symbol_*,_SmallVector<DataFlowState>_> *local_240;
  char_pointer local_238;
  table_element_pointer local_230;
  char_pointer local_228;
  table_element_pointer local_220;
  flat_hash_map<const_Symbol_*,_SmallVector<DataFlowState>_> *local_218;
  char_pointer local_210;
  table_element_pointer local_208;
  undefined1 *local_200;
  undefined1 local_1f1;
  SmallVector<slang::analysis::DataFlowState,_2UL> *local_1f0;
  undefined8 *local_1e8;
  flat_hash_map<const_Symbol_*,_SmallVector<DataFlowState>_> *local_1e0;
  bool local_1d1 [25];
  iterator local_1b8;
  bool local_1a1 [25];
  iterator local_188;
  bool local_171;
  iterator local_170;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>
  local_160;
  size_t local_148;
  DataFlowState *local_140;
  SmallVector<slang::analysis::DataFlowState,_2UL> *local_138;
  SmallVector<slang::analysis::DataFlowState,_2UL> *local_130;
  undefined8 *local_128;
  undefined1 *local_120;
  flat_hash_map<const_Symbol_*,_SmallVector<DataFlowState>_> *local_118;
  uint local_10c;
  value_type *local_108;
  value_type *local_100;
  uint local_f4;
  group_type *local_f0;
  size_t local_e8;
  pow2_quadratic_prober local_e0;
  DataFlowState *local_d0;
  size_t local_c8;
  SmallVector<slang::analysis::DataFlowState,_2UL> *local_c0;
  flat_hash_map<const_Symbol_*,_SmallVector<DataFlowState>_> *local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>
  local_b0;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> *local_98;
  flat_hash_map<const_Symbol_*,_SmallVector<DataFlowState>_> *local_90;
  iterator local_88;
  size_t local_78;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> *local_70;
  flat_hash_map<const_Symbol_*,_SmallVector<DataFlowState>_> *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> *local_10;
  flat_hash_map<const_Symbol_*,_SmallVector<DataFlowState>_> *local_8;
  
  local_270 = in_RSI;
  if (*(long *)(in_RSI + 0x28) != 0) {
    pfVar9 = &(in_RDI->
              super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              ).disableBranches;
    local_290 = *(undefined8 *)(in_RSI + 0x28);
    args_2 = &local_3e8;
    SmallVector<slang::analysis::DataFlowState,_2UL>::SmallVector
              ((SmallVector<slang::analysis::DataFlowState,_2UL> *)0x833da3);
    local_258 = &local_290;
    local_120 = &local_1f1;
    local_260 = args_2;
    local_250 = pfVar9;
    local_1f0 = args_2;
    local_1e8 = local_258;
    local_1e0 = pfVar9;
    local_130 = args_2;
    local_128 = local_258;
    local_118 = pfVar9;
    local_138 = (SmallVector<slang::analysis::DataFlowState,_2UL> *)
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
                ::
                key_from<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>
                          (local_258,args_2);
    in_stack_fffffffffffff890 =
         (DataFlowState *)
         boost::unordered::detail::foa::
         table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
         ::hash_for<slang::ast::Symbol_const*>
                   ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                     *)in_stack_fffffffffffff810,(Symbol **)in_stack_fffffffffffff808);
    local_140 = in_stack_fffffffffffff890;
    local_148 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                                *)in_stack_fffffffffffff810,(size_t)in_stack_fffffffffffff808);
    local_c0 = local_138;
    local_d0 = local_140;
    pfVar7 = pfVar9;
    local_c8 = local_148;
    local_b8 = pfVar9;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_e0,local_148)
    ;
    do {
      local_e8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_e0);
      local_f0 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                 ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                           *)0x833f43);
      local_f0 = local_f0 + local_e8;
      in_stack_fffffffffffff864 =
           boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           match((group15<boost::unordered::detail::foa::plain_integral> *)in_stack_fffffffffffff818
                 ,(size_t)in_stack_fffffffffffff810);
      local_f4 = in_stack_fffffffffffff864;
      if (in_stack_fffffffffffff864 != 0) {
        local_100 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                    ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                                *)0x833f98);
        local_108 = local_100 + local_e8 * 0xf;
        do {
          local_10c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          this_00 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                    ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                            *)0x833feb);
          in_stack_fffffffffffff850 = local_c0;
          in_stack_fffffffffffff858 =
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
               ::
               key_from<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>
                         ((pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>
                           *)0x83401b);
          bVar1 = std::equal_to<const_slang::ast::Symbol_*>::operator()
                            (this_00,(Symbol **)in_stack_fffffffffffff850,in_stack_fffffffffffff858)
          ;
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>
            ::table_locator(&local_160,local_f0,local_10c,local_108 + local_10c);
            goto LAB_00834125;
          }
          local_f4 = local_f4 - 1 & local_f4;
        } while (local_f4 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffff810,(size_t)in_stack_fffffffffffff808);
      in_stack_fffffffffffff844 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff844);
      if (bVar1) {
        memset(&local_160,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>
        ::table_locator(&local_160);
        goto LAB_00834125;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_e0,
                         (pfVar9->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                         .arrays.groups_size_mask);
    } while (bVar1);
    memset(&local_160,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>
    ::table_locator(&local_160);
LAB_00834125:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_160);
    if (bVar1) {
      local_170 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                  ::make_iterator((locator *)0x834147);
      local_171 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_288,&local_170,&local_171);
    }
    else if ((pfVar7->table_).
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
             .size_ctrl.size <
             (pfVar7->table_).
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
             .size_ctrl.ml) {
      in_stack_fffffffffffff808 = local_130;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>
                ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840),
                 in_stack_fffffffffffff838,in_stack_fffffffffffff830,in_stack_fffffffffffff828,
                 (Symbol **)in_stack_fffffffffffff820,in_stack_fffffffffffff850);
      local_188 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                  ::make_iterator((locator *)0x8341e9);
      local_1a1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_288,&local_188,local_1a1);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>
                (in_stack_fffffffffffff8a0,(size_t)in_RDI,
                 (try_emplace_args_t *)in_stack_fffffffffffff890,(Symbol **)pfVar7,args_2);
      local_1b8 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                  ::make_iterator((locator *)0x834264);
      local_1d1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_288,&local_1b8,local_1d1);
    }
    SmallVector<slang::analysis::DataFlowState,_2UL>::~SmallVector
              ((SmallVector<slang::analysis::DataFlowState,_2UL> *)0x8342ac);
    local_400 = std::
                get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                            *)0x8342b9);
    local_408 = std::
                get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                            *)0x8342ce);
  }
  if (*(int *)(local_270 + 0x30) == 0) {
    visit<slang::ast::Statement>(in_stack_fffffffffffff810,(Statement *)in_stack_fffffffffffff808);
  }
  else {
    local_410 = *(undefined8 *)(local_270 + 0x20);
    if (**(int **)(local_270 + 0x20) == 2) {
      pSVar2 = ast::Statement::as<slang::ast::StatementList>(*(Statement **)(local_270 + 0x20));
      local_420 = (pSVar2->list)._M_ptr;
      local_418 = (pSVar2->list)._M_extent._M_extent_value;
    }
    else {
      std::span<const_slang::ast::Statement_*,_18446744073709551615UL>::
      span<const_slang::ast::Statement_**>
                ((span<const_slang::ast::Statement_*,_18446744073709551615UL> *)
                 in_stack_fffffffffffff820,(Statement **)in_stack_fffffffffffff818,
                 (size_type)in_stack_fffffffffffff810);
      std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::
      span<const_slang::ast::Statement_*,_18446744073709551615UL>
                (in_stack_fffffffffffff820,in_stack_fffffffffffff818);
    }
    local_438 = 0;
    local_440 = &local_420;
    local_448._M_current =
         (Statement **)
         std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Statement_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffff808);
    local_450 = (Statement **)
                std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::end
                          ((span<const_slang::ast::Statement_*const,_18446744073709551615UL> *)
                           in_stack_fffffffffffff818);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffff810,
                              (__normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffff808), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppSVar3 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                ::operator*(&local_448);
      local_458 = *ppSVar3;
      if (local_458->kind != VariableDeclaration) break;
      visit<slang::ast::Statement>(in_stack_fffffffffffff810,(Statement *)in_stack_fffffffffffff808)
      ;
      local_438 = local_438 + 1;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
      ::operator++(&local_448);
    }
    local_468 = std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::subspan
                          (in_stack_fffffffffffff820,(size_type)in_stack_fffffffffffff818,
                           (size_type)in_stack_fffffffffffff810);
    local_420 = local_468._M_ptr;
    local_418 = local_468._M_extent._M_extent_value;
    DataFlowAnalysis::copyState(in_RDI,in_stack_fffffffffffff890);
    DataFlowState::DataFlowState
              ((DataFlowState *)in_stack_fffffffffffff810,(DataFlowState *)in_stack_fffffffffffff808
              );
    local_5b0 = &local_420;
    local_5b8._M_current =
         (Statement **)
         std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Statement_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffff808);
    std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::end
              ((span<const_slang::ast::Statement_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffff818);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffff810,
                              (__normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffff808), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
      ::operator*(&local_5b8);
      DataFlowAnalysis::copyState(in_RDI,in_stack_fffffffffffff890);
      setState(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      DataFlowState::~DataFlowState((DataFlowState *)0x8345ad);
      visit<slang::ast::Statement>(in_stack_fffffffffffff810,(Statement *)in_stack_fffffffffffff808)
      ;
      if (*(int *)(local_270 + 0x30) == 1) {
        DataFlowAnalysis::meetState
                  (in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900);
      }
      else if (*(int *)(local_270 + 0x30) == 2) {
        sVar4 = std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::size
                          ((span<const_slang::ast::Statement_*const,_18446744073709551615UL> *)
                           0x83463a);
        if (sVar4 == 1) {
          DataFlowAnalysis::meetState
                    (in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900);
        }
        else {
          DataFlowAnalysis::joinState
                    (in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
      ::operator++(&local_5b8);
    }
    DataFlowState::DataFlowState
              ((DataFlowState *)in_stack_fffffffffffff810,(DataFlowState *)in_stack_fffffffffffff808
              );
    setState(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    DataFlowState::~DataFlowState((DataFlowState *)0x8346fc);
    DataFlowState::~DataFlowState((DataFlowState *)0x834709);
    DataFlowState::~DataFlowState((DataFlowState *)0x834716);
  }
  if (*(long *)(local_270 + 0x28) != 0) {
    pfVar7 = &(in_RDI->
              super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              ).disableBranches;
    local_720._M_ptr = *(pointer *)(local_270 + 0x28);
    local_248 = &local_720;
    local_240 = pfVar7;
    local_98 = local_248;
    local_90 = pfVar7;
    local_70 = local_248;
    local_68 = pfVar7;
    local_78 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
               ::hash_for<slang::ast::Symbol_const*>
                         ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                           *)in_stack_fffffffffffff810,(Symbol **)in_stack_fffffffffffff808);
    psVar8 = local_70;
    local_18 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                               *)in_stack_fffffffffffff810,(size_t)in_stack_fffffffffffff808);
    local_20 = local_78;
    local_10 = psVar8;
    local_8 = pfVar7;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                 ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                           *)0x83489c);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffff818,(size_t)in_stack_fffffffffffff810);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                   ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                               *)0x8348e7);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffff810 =
               (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                *)boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                          *)0x83493a);
          in_stack_fffffffffffff818 = local_10;
          __y = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<slang::analysis::DataFlowState,2ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>>
                ::
                key_from<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<slang::analysis::DataFlowState,2ul>>>
                          ((pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>
                            *)0x83496a);
          bVar1 = std::equal_to<const_slang::ast::Symbol_*>::operator()
                            ((equal_to<const_slang::ast::Symbol_*> *)in_stack_fffffffffffff810,
                             (Symbol **)in_stack_fffffffffffff818,__y);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>
            ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
            goto LAB_00834a61;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffff810,(size_t)in_stack_fffffffffffff808);
      if (bVar1) {
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>
        ::table_locator(&local_b0);
        goto LAB_00834a61;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,
                         (pfVar7->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState>_>_>_>
                         .arrays.groups_size_mask);
    } while (bVar1);
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>
    ::table_locator(&local_b0);
LAB_00834a61:
    local_88 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
               ::make_iterator((locator *)0x834a6e);
    local_238 = local_88.pc_;
    local_230 = local_88.p_;
    local_720._M_extent._M_extent_value = (size_t)local_88.pc_;
    local_710 = local_88.p_;
    ppVar5 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)in_stack_fffffffffffff810);
    local_730 = SmallVectorBase<slang::analysis::DataFlowState>::begin
                          (&(ppVar5->second).super_SmallVectorBase<slang::analysis::DataFlowState>);
    pDVar6 = SmallVectorBase<slang::analysis::DataFlowState>::end
                       (&(ppVar5->second).super_SmallVectorBase<slang::analysis::DataFlowState>);
    for (; local_730 != pDVar6; local_730 = local_730 + 1) {
      DataFlowAnalysis::joinState
                (in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930);
    }
    local_218 = &(in_RDI->
                 super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                 ).disableBranches;
    local_200 = &stack0xfffffffffffff8a0;
    local_210 = (char_pointer)local_720._M_extent._M_extent_value;
    local_208 = local_710;
    local_228 = (char_pointer)local_720._M_extent._M_extent_value;
    local_220 = local_710;
    pos_00.p_._0_4_ = in_stack_fffffffffffff860;
    pos_00.pc_ = (char_pointer)in_stack_fffffffffffff858;
    pos_00.p_._4_4_ = in_stack_fffffffffffff864;
    boost::unordered::detail::foa::
    table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
    ::erase<false,_nullptr>
              ((table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<slang::analysis::DataFlowState,_2UL>_>_>_>
                *)in_stack_fffffffffffff850,pos_00);
  }
  return;
}

Assistant:

void visitStmt(const BlockStatement& stmt) {
        // This block could be the target of a disable statement.
        if (stmt.blockSymbol) {
            auto [it, inserted] = disableBranches.try_emplace(stmt.blockSymbol,
                                                              SmallVector<TState>{});
            SLANG_ASSERT(inserted);
        }

        if (stmt.blockKind == StatementBlockKind::Sequential) {
            visit(stmt.body);
        }
        else {
            auto stmtPtr = &stmt.body;
            auto statements = stmt.body.kind == StatementKind::List
                                  ? stmt.body.as<StatementList>().list
                                  : std::span(&stmtPtr, 1);
            size_t numLocalDecls = 0;
            for (auto s : statements) {
                // Variable declaration initializers happen before
                // we fork the remaining statements.
                if (s->kind == StatementKind::VariableDeclaration) {
                    visit(*s);
                    numLocalDecls++;
                }
                else {
                    break;
                }
            }
            statements = statements.subspan(numLocalDecls);

            // Each remaining statement is executed in parallel.
            auto currState = (DERIVED).copyState(state);
            auto finalState = std::move(state);
            for (auto s : statements) {
                setState((DERIVED).copyState(currState));
                visit(*s);

                switch (stmt.blockKind) {
                    case StatementBlockKind::JoinAny:
                        // If there's only one statement (a pathological case)
                        // then we can meet it; otherwise we must join since
                        // there is uncertainty about which path was taken.
                        if (statements.size() == 1)
                            (DERIVED).meetState(finalState, state);
                        else
                            (DERIVED).joinState(finalState, state);
                        break;
                    case StatementBlockKind::JoinAll:
                        // All paths must be taken, so we meet the states.
                        (DERIVED).meetState(finalState, state);
                        break;
                    case StatementBlockKind::JoinNone:
                        // No paths will be taken by the time the fork
                        // moves on so we discard this state.
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            setState(std::move(finalState));
        }

        // Once we're done with a block we remove it as a disable target.
        // A disable statement can target any block in the hierarchy but
        // we don't analyze the control flow implications for targets that
        // aren't part of the current execution stack.
        if (stmt.blockSymbol) {
            auto it = disableBranches.find(stmt.blockSymbol);
            SLANG_ASSERT(it != disableBranches.end());

            for (auto& branchState : it->second)
                (DERIVED).joinState(state, branchState);

            disableBranches.erase(it);
        }
    }